

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.hpp
# Opt level: O3

DescriptorSet * __thiscall
Diligent::ShaderResourceCacheVk::GetDescriptorSet(ShaderResourceCacheVk *this,Uint32 Index)

{
  char (*in_RCX) [18];
  string msg;
  string local_38;
  
  if (this->m_NumSets <= Index) {
    FormatString<char[26],char[18]>
              (&local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])"Index < m_NumSets"
               ,in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetDescriptorSet",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderResourceCacheVk.hpp"
               ,0xbf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return (DescriptorSet *)
         ((ulong)Index * 0x30 +
         (long)(this->m_pMemory)._M_t.
               super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
               _M_t.
               super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
               .super__Head_base<0UL,_void_*,_false>._M_head_impl);
}

Assistant:

const DescriptorSet& GetDescriptorSet(Uint32 Index) const
    {
        VERIFY_EXPR(Index < m_NumSets);
        return reinterpret_cast<const DescriptorSet*>(m_pMemory.get())[Index];
    }